

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learn.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double *pdVar1;
  int *piVar2;
  pointer pdVar3;
  int iVar4;
  int iVar5;
  clock_t cVar6;
  char **ppcVar7;
  FILE *pFVar8;
  char *pcVar9;
  clock_t cVar10;
  pointer pvVar11;
  int j;
  char **ppcVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  int true_y_1;
  int j_1;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  int i;
  ulong uVar20;
  int j_2;
  long lVar21;
  bool bVar22;
  int true_y;
  char *data_file;
  double dVar23;
  
  pcVar9 = argv[1];
  ts_len = atoi(argv[2]);
  data_file = argv[3];
  data_n = atoi(argv[4]);
  alpha = atof(argv[5]);
  readfile(data_file);
  cVar6 = clock();
  iVar5 = strcmp(pcVar9,"train");
  if (iVar5 == 0) {
    regularization = atof(argv[6]);
    max_iter = atoi(argv[7]);
    learn_rate = atof(argv[8]);
    if (argc == 0xb) {
      test_n = atoi(argv[10]);
      readtestfile(argv[9]);
    }
    init((EVP_PKEY_CTX *)0x0);
    bVar22 = true;
    for (uVar20 = 0; (int)uVar20 < max_iter; uVar20 = (ulong)((int)uVar20 + 1)) {
      iVar5 = (int)(uVar20 % 100);
      if (iVar5 == 0) {
        printf("epoch %d\n",uVar20);
      }
      for (lVar15 = 0; lVar15 < data_n; lVar15 = lVar15 + 1) {
        if (bVar22) {
          puts("data format:");
          puts("data:");
          for (lVar21 = 0; lVar21 < ts_len; lVar21 = lVar21 + 1) {
            printf("%9.6f",data_x.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar15].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar21]);
          }
          putchar(10);
          puts("label:");
          for (lVar21 = 0; lVar21 < num_c; lVar21 = lVar21 + 1) {
            printf("%9.0f",data_y.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar15].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar21]);
          }
          putchar(10);
        }
        train(data_x.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar15,
              data_y.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar15,regularization);
        bVar22 = false;
      }
      std::vector<int,_std::allocator<int>_>::push_back(&rightlog,&right_cnt);
      iVar4 = test_n;
      right_cnt = 0;
      if (iVar5 == 0 && argc == 0xb) {
        iVar5 = 0;
        for (lVar15 = 0; lVar15 < test_n; lVar15 = lVar15 + 1) {
          pvVar11 = test_y.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar15;
          ppcVar7 = (char **)(ulong)(uint)num_c;
          if (num_c < 1) {
            ppcVar7 = (char **)0x0;
          }
          for (ppcVar12 = (char **)0x0; ppcVar7 != ppcVar12;
              ppcVar12 = (char **)((long)ppcVar12 + 1)) {
            pdVar3 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if (0.0 < pdVar3[(long)ppcVar12]) {
              argv = ppcVar12;
            }
            argv = (char **)((ulong)argv & 0xffffffff);
            pdVar3[(long)ppcVar12] = 0.0;
          }
          predict(test_x.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar15,
                  test_y.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar15);
          uVar16 = 0;
          for (uVar13 = 1; (long)uVar13 < (long)num_c; uVar13 = uVar13 + 1) {
            pdVar3 = test_y.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar15].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar23 = pdVar3[uVar13];
            pdVar1 = pdVar3 + (int)uVar16;
            uVar18 = uVar13 & 0xffffffff;
            if (dVar23 < *pdVar1 || dVar23 == *pdVar1) {
              uVar18 = uVar16;
            }
            uVar16 = uVar18;
          }
          uVar13 = (ulong)(uint)num_c;
          if (num_c < 1) {
            uVar13 = 0;
          }
          for (uVar18 = 0; uVar13 != uVar18; uVar18 = uVar18 + 1) {
            dVar23 = 1.0;
            if (((ulong)argv & 0xffffffff) != uVar18) {
              dVar23 = 0.0;
            }
            test_y.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar15].
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar18] = dVar23;
          }
          iVar5 = iVar5 + (uint)((int)argv != (int)uVar16);
        }
        printf("Accuracy = %8.3f Correct = %5d , Wrong = %5d\n",
               ((double)(iVar4 - iVar5) * 100.0) / (double)iVar4);
      }
    }
    pFVar8 = fopen("rightlog","w");
    uVar20 = 0;
    while ((long)uVar20 < (long)max_iter) {
      piVar2 = rightlog.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + uVar20;
      uVar20 = uVar20 + 1;
      fprintf(pFVar8,"epoch %d accuracy %f\n",(double)*piVar2 / (double)data_n,uVar20 & 0xffffffff);
    }
    fclose(pFVar8);
    save();
  }
  else {
    iVar5 = strcmp(pcVar9,"test");
    if (iVar5 == 0) {
      init((EVP_PKEY_CTX *)0x1);
      iVar4 = data_n;
      pFVar8 = fopen("result.txt","a");
      iVar5 = 0;
      uVar20 = 0;
      while (uVar13 = uVar20, (long)uVar13 < (long)data_n) {
        pvVar11 = data_y.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar13;
        pcVar9 = (char *)(ulong)(uint)num_c;
        if (num_c < 1) {
          pcVar9 = (char *)0x0;
        }
        for (pcVar14 = (char *)0x0; pcVar9 != pcVar14; pcVar14 = pcVar14 + 1) {
          pdVar3 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (0.0 < pdVar3[(long)pcVar14]) {
            data_file = pcVar14;
          }
          data_file = (char *)((ulong)data_file & 0xffffffff);
          pdVar3[(long)pcVar14] = 0.0;
        }
        predict(data_x.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar13,
                data_y.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar13);
        iVar19 = 0;
        for (lVar15 = 1; lVar15 < num_c; lVar15 = lVar15 + 1) {
          pdVar3 = data_y.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar13].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar23 = pdVar3[lVar15];
          pdVar1 = pdVar3 + iVar19;
          iVar17 = (int)lVar15;
          if (dVar23 < *pdVar1 || dVar23 == *pdVar1) {
            iVar17 = iVar19;
          }
          iVar19 = iVar17;
        }
        uVar20 = uVar13 + 1;
        if ((int)data_file != iVar19) {
          fprintf(pFVar8,"%d case true label %d predict label %d\n",uVar20 & 0xffffffff,
                  (ulong)data_file & 0xffffffff);
          for (uVar16 = 0; (long)uVar16 < (long)num_c; uVar16 = uVar16 + 1) {
            fprintf(pFVar8,"%9.6f",
                    data_y.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar13].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar16]);
            iVar19 = 0x2c;
            if (uVar16 == num_c - 1) {
              iVar19 = 10;
            }
            fputc(iVar19,pFVar8);
          }
          iVar5 = iVar5 + 1;
        }
      }
      fprintf(pFVar8,"Accuracy = %8.3f Correct = %5d , Wrong = %5d\n",
              ((double)(iVar4 - iVar5) * 100.0) / (double)iVar4);
      fclose(pFVar8);
    }
    else {
      puts("wrong operation !");
    }
  }
  cVar10 = clock();
  printf("Total Running Time = %.3f sec\n",((double)cVar10 - (double)cVar6) / 1000000.0);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

    /**
     * arguments:
     * 1.train ts_len data_file data_n alpha regular max_iter learn_rate [test_data_file test_n]
     * 2.test ts_len data_file data_n alpha
     */
    char *operation = argv[1];
    ts_len = atoi(argv[2]);

    char *data_file = argv[3];
    data_n = atoi(argv[4]);

    alpha = atof(argv[5]);

    readfile(data_file);

    double start_time = clock();

    if (strcmp(operation, "train") == 0) {

        regularization = atof(argv[6]);
        max_iter = atoi(argv[7]);
        learn_rate = atof(argv[8]);

        if (argc == 11) {
            test_n = atoi(argv[10]);
            readtestfile(argv[9]);
        }

        init(0);

        // training
        bool first = true;
        for (int epoch = 0; epoch < max_iter; ++epoch) {
            if (epoch % 100 == 0)
                printf("epoch %d\n", epoch);
            for (int i = 0; i < data_n; ++i) {
                if (first) {
                    printf("data format:\n");
                    printf("data:\n");
                    for (int j = 0; j < ts_len; ++j) {
                        printf("%9.6f", data_x[i][j]);
                    }
                    printf("\n");
                    printf("label:\n");
                    for (int j = 0; j < num_c; ++j) {
                        printf("%9.0f", data_y[i][j]);
                    }
                    printf("\n");
                    first = false;
                }
                train(data_x[i], data_y[i], regularization);
            }

            if (PRINT_LOG) {
                rightlog.push_back(right_cnt);
//                printf("epoch %d accuracy %f\n", epoch, 1.0 * right_cnt / data_n);
                right_cnt = 0;

                if (argc == 11 && epoch % 100 == 0) {
                    int total_case = test_n;
                    int total_wrong = 0;

                    //testing
                    for (int i = 0; i < test_n; ++i) {

                        int true_y, pred_y = 0;
                        for (int j = 0; j < num_c; j++) {
                            if (test_y[i][j] > 0) {
                                true_y = j;
                            }
                            test_y[i][j] = 0; // clear y
                        }

                        predict(test_x[i], test_y[i]);

                        // find the max(y) and its index is the label of the case
                        for (int j = 1; j < num_c; j++) {
                            if (test_y[i][j] > test_y[i][pred_y]) {
                                pred_y = j;
                            }
                        }

                        if (true_y != pred_y) {
                            ++total_wrong;
                        }

                        // reset y
                        for (int j = 0; j < num_c; j++) {
                            test_y[i][j] = 0.0;
                            if (j == true_y) {
                                test_y[i][j] = 1.0;
                            }
                        }

                    }

                    printf("Accuracy = %8.3f Correct = %5d , Wrong = %5d\n",
                           100.0 * (total_case - total_wrong) / total_case, total_case - total_wrong, total_wrong);
                }

            }

        }

        if (PRINT_LOG) {
            FILE *flog;
            flog = fopen("rightlog", "w");
            for (int i = 0; i < max_iter; ++i) {
                fprintf(flog, "epoch %d accuracy %f\n", i + 1, 1.0 * rightlog[i] / data_n);
            }
            fclose(flog);
        }

        // output w, w0 and shapelet
        save();

    } else if (strcmp(operation, "test") == 0) {

        // input w, w0 and shapelet
        init(1);

        int total_case = data_n;
        int total_wrong = 0;
        FILE *f = fopen("result.txt", "a");

        //testing
        for (int i = 0; i < data_n; ++i) {

            int true_y, pred_y = 0;
            for (int j = 0; j < num_c; j++) {
                if (data_y[i][j] > 0) {
                    true_y = j;
                }
                data_y[i][j] = 0; // clear y
            }

            predict(data_x[i], data_y[i]);
            // find the max(y) and its index is the label of the case
            for (int j = 1; j < num_c; j++) {
                if (data_y[i][j] > data_y[i][pred_y]) {
                    pred_y = j;
                }
            }

            // a wrong case found
            if (true_y != pred_y) {
                ++total_wrong;
                fprintf(f, "%d case true label %d predict label %d\n", i + 1, true_y, pred_y);
                for (int j = 0; j < num_c; ++j) {
                    fprintf(f, "%9.6f", data_y[i][j]);
                    if (j != num_c - 1) {
                        fprintf(f, ",");
                    } else {
                        fprintf(f, "\n");
                    }
                }
            }

        }

        fprintf(f, "Accuracy = %8.3f Correct = %5d , Wrong = %5d\n", 100.0 * (total_case - total_wrong) / total_case,
                total_case - total_wrong, total_wrong);
        fclose(f);

    } else {
        printf("wrong operation !\n");
    }

    double end_time = clock();
    printf("Total Running Time = %.3f sec\n", (end_time - start_time) / CLOCKS_PER_SEC);

    return 0;
}